

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O3

void __thiscall TString::ToUpperCase(TString *this)

{
  char *pcVar1;
  long lVar2;
  char cVar3;
  char *pcVar4;
  
  pcVar1 = this->myString;
  cVar3 = *pcVar1;
  if (cVar3 != '\0') {
    lVar2 = 1;
    pcVar4 = pcVar1;
    do {
      if ((byte)(cVar3 + 0x9fU) < 0x1a) {
        *pcVar4 = cVar3 + -0x20;
        pcVar1 = this->myString;
      }
      pcVar4 = pcVar1 + lVar2;
      cVar3 = pcVar1[lVar2];
      lVar2 = lVar2 + 1;
    } while (cVar3 != '\0');
  }
  return;
}

Assistant:

void TString::ToUpperCase(void)
{
	for(int i = 0; *(myString + i) != '\0'; i++)
		if(*(myString + i) >= 'a' && *(myString + i) <= 'z')
			*(myString + i) += 'A' - 'a';
}